

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeanLoader.h
# Opt level: O0

int __thiscall hiberlite::LoadBean::locateCol(LoadBean *this,string *name)

{
  __type_conflict _Var1;
  database_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [32];
  undefined1 local_48 [40];
  uint i;
  uint n;
  SQLiteSelect *sel;
  string *name_local;
  LoadBean *this_local;
  
  sel = (SQLiteSelect *)name;
  name_local = (string *)this;
  _i = std::
       stack<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::deque<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::allocator<std::pair<hiberlite::SQLiteSelect,_long_long>_>_>_>
       ::top(&this->stmt);
  local_48._36_4_ = SQLiteSelect::column_count(&_i->first);
  local_48._32_4_ = 0;
  while( true ) {
    if ((uint)local_48._36_4_ <= (uint)local_48._32_4_) {
      this_00 = (database_error *)__cxa_allocate_exception(0x10);
      std::operator+(local_68,(char *)name);
      database_error::database_error(this_00,local_68);
      __cxa_throw(this_00,&database_error::typeinfo,database_error::~database_error);
    }
    SQLiteSelect::get_name_abi_cxx11_((SQLiteSelect *)local_48,(int)_i);
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_48,name);
    std::__cxx11::string::~string((string *)local_48);
    if (_Var1) break;
    local_48._32_4_ = local_48._32_4_ + 1;
  }
  return local_48._32_4_;
}

Assistant:

inline int locateCol(std::string name){
			SQLiteSelect& sel=stmt.top().first;
			unsigned int n=sel.column_count();
			for(unsigned int i=0;i<n;i++)
			if(sel.get_name(i)==name)
				return i;
			throw database_error(name+": column not found in SELECT query results");
		}